

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O0

void __thiscall DNSResolver::ChangetoDnsNameFormat(DNSResolver *this,uchar *dns,uchar *host)

{
  long lVar1;
  char *pcVar2;
  uchar *__src;
  size_t sVar3;
  undefined8 uStack_50;
  ulong local_48;
  char *local_40;
  long local_38;
  unsigned_long __vla_expr0;
  int local_28;
  int local_24;
  int i;
  int lock;
  uchar *host_local;
  uchar *dns_local;
  DNSResolver *this_local;
  
  local_24 = 0;
  uStack_50 = 0x107324;
  _i = host;
  host_local = dns;
  dns_local = this->buf;
  sVar3 = strlen((char *)host);
  __src = _i;
  local_38 = sVar3 + 1;
  lVar1 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
  local_40 = (char *)((long)&local_48 + lVar1);
  __vla_expr0 = (unsigned_long)&local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x107356;
  strcpy((char *)((long)&local_48 + lVar1),(char *)__src);
  pcVar2 = local_40;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x107366;
  strcat(pcVar2,".");
  local_28 = 0;
  while( true ) {
    pcVar2 = local_40;
    local_48 = (ulong)local_28;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10737e;
    sVar3 = strlen(pcVar2);
    if (sVar3 <= local_48) break;
    if (local_40[local_28] == '.') {
      *host_local = (char)local_28 - (char)local_24;
      for (; host_local = host_local + 1, local_24 < local_28; local_24 = local_24 + 1) {
        *host_local = local_40[local_24];
      }
      local_24 = local_24 + 1;
    }
    local_28 = local_28 + 1;
  }
  *host_local = '\0';
  return;
}

Assistant:

void DNSResolver::ChangetoDnsNameFormat(unsigned char *dns, unsigned char *host) {
    int lock = 0, i;
    char tmp[strlen(reinterpret_cast<const char *>(host)) + 1];
    strcpy(tmp, reinterpret_cast<const char *>(host));
    strcat(tmp, ".");
    for (i = 0; i < strlen(tmp); i++) {
        if (tmp[i] == '.') {
            *dns++ = i - lock;
            for (; lock < i; lock++) {
                *dns++ = tmp[lock];
            }
            lock++; //or lock=i+1;
        }
    }
    *dns++ = '\0';
}